

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,char *c)

{
  s32 l;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar2 = this->array;
  if (c == (char *)0x0) {
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)operator_new__(1);
      this->array = pcVar2;
      this->allocated = 1;
      this->used = 1;
    }
    *pcVar2 = '\0';
  }
  else if (pcVar2 != c) {
    if (*c == '\0') {
      uVar1 = 1;
    }
    else {
      uVar1 = 1;
      do {
        pcVar3 = c + uVar1;
        uVar1 = uVar1 + 1;
      } while (*pcVar3 != '\0');
    }
    this->used = (s32)uVar1;
    this->allocated = (s32)uVar1;
    pcVar3 = (char *)operator_new__(uVar1 & 0xffffffff);
    this->array = pcVar3;
    uVar4 = 0;
    do {
      this->array[uVar4] = c[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar1 & 0xffffffff) != uVar4);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}